

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O2

int zt_base_decode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  bool bVar12;
  int local_58 [10];
  
  iVar2 = _valid_dictionary_p(def);
  if (out_bytes == (size_t *)0x0) {
    return -1;
  }
  if (iVar2 == 0) {
    return -1;
  }
  if (in == (void *)0x0 || in_bytes == 0) {
    *out_bytes = 0;
    return 0;
  }
  uVar3 = in_bytes - 1;
  uVar5 = (long)uVar3 >> 0x3f & uVar3;
  uVar8 = 0;
  for (; (uVar6 = uVar5, 0 < (long)uVar3 &&
         (uVar6 = uVar8, (uint)*(byte *)((long)in + uVar3) == (int)def->pad)); uVar3 = uVar3 - 1) {
    uVar8 = uVar8 + 1;
  }
  uVar3 = (ulong)def->igroups * ((in_bytes - uVar6) / (ulong)def->ogroups) +
          (in_bytes - uVar6) % (ulong)def->ogroups;
  if (out == (void **)0x0) {
    *out_bytes = uVar3;
    return 0;
  }
  pbVar4 = (byte *)*out;
  if (pbVar4 == (byte *)0x0) {
    if (*out_bytes == 0) {
      pbVar4 = (byte *)zt_calloc_p(uVar3 + 1,1);
      if (pbVar4 == (byte *)0x0) {
        return -1;
      }
      *out = pbVar4;
      *out_bytes = uVar3;
    }
    else {
      pbVar4 = (byte *)0x0;
    }
  }
  else if (*out_bytes < uVar3) {
    *out_bytes = uVar3;
    return -2;
  }
  sVar7 = def->base;
  if (sVar7 == 0x10) {
    lVar9 = 0;
    sVar7 = 0;
    sVar10 = 0;
    do {
      if (in_bytes == sVar10) {
        *out_bytes = sVar7;
        return 0;
      }
      cVar1 = def->dictionary[*(byte *)((long)in + sVar10)];
      if (cVar1 < '\0') {
        if (cVar1 == -1) {
          return -1;
        }
      }
      else {
        local_58[lVar9] = (int)cVar1;
        bVar12 = lVar9 == 1;
        lVar9 = 1;
        if (bVar12) {
          *pbVar4 = (byte)(local_58[0] << 4) | (byte)local_58[1];
          pbVar4 = pbVar4 + 1;
          sVar7 = sVar7 + 1;
          lVar9 = 0;
        }
      }
      sVar10 = sVar10 + 1;
    } while( true );
  }
  if (sVar7 == 0x20) {
    sVar7 = 0;
    lVar9 = 0;
    sVar10 = 0;
    do {
      if (in_bytes == sVar10) {
        iVar2 = 0;
        cVar1 = (char)local_58[2];
        switch(lVar9) {
        case 0:
          break;
        default:
          iVar2 = -1;
          break;
        case 2:
          *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          sVar7 = sVar7 + 1;
          break;
        case 4:
          *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar4[1] = (byte)((uint)local_58[3] >> 4) | cVar1 * '\x02' | (byte)(local_58[1] << 6);
          sVar7 = sVar7 + 2;
          break;
        case 5:
          *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar4[1] = (byte)((uint)local_58[3] >> 4) | cVar1 * '\x02' | (byte)(local_58[1] << 6);
          pbVar4[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
          sVar7 = sVar7 + 3;
          break;
        case 6:
          return -1;
        case 7:
          *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar4[1] = (byte)((uint)local_58[3] >> 4) | cVar1 * '\x02' | (byte)(local_58[1] << 6);
          pbVar4[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
          pbVar4[3] = (byte)((uint)local_58[6] >> 3) |
                      (byte)(local_58[5] << 2) | (byte)(local_58[4] << 7);
          sVar7 = sVar7 + 4;
        }
        *out_bytes = sVar7;
        return iVar2;
      }
      cVar1 = def->dictionary[*(byte *)((long)in + sVar10)];
      if (cVar1 < '\0') {
        if (cVar1 == -1) {
          return -1;
        }
      }
      else {
        local_58[lVar9] = (int)cVar1;
        lVar9 = lVar9 + 1;
        if (lVar9 == 8) {
          *pbVar4 = (byte)((uint)local_58[1] >> 2) | (byte)(local_58[0] << 3);
          pbVar4[1] = (byte)((uint)local_58[3] >> 4) |
                      (char)local_58[2] * '\x02' | (byte)(local_58[1] << 6);
          pbVar4[2] = (byte)((uint)local_58[4] >> 1) | (byte)(local_58[3] << 4);
          pbVar4[3] = (byte)((uint)local_58[6] >> 3) |
                      (byte)(local_58[5] << 2) | (byte)(local_58[4] << 7);
          pbVar4[4] = (byte)(local_58[6] << 5) | (byte)local_58[7];
          pbVar4 = pbVar4 + 5;
          sVar7 = sVar7 + 5;
          lVar9 = 0;
        }
      }
      sVar10 = sVar10 + 1;
    } while( true );
  }
  if (sVar7 != 0x40) {
    return -1;
  }
  sVar7 = 0;
  lVar9 = 0;
  for (sVar10 = 0; in_bytes != sVar10; sVar10 = sVar10 + 1) {
    cVar1 = def->dictionary[*(byte *)((long)in + sVar10)];
    if (cVar1 < '\0') {
      if (cVar1 == -1) {
        return -1;
      }
    }
    else {
      local_58[lVar9] = (int)cVar1;
      lVar9 = lVar9 + 1;
      if (lVar9 == 4) {
        *pbVar4 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
        pbVar4[1] = (byte)((uint)local_58[2] >> 2) | (byte)(local_58[1] << 4);
        pbVar4[2] = (byte)(local_58[2] << 6) | (byte)local_58[3];
        pbVar4 = pbVar4 + 3;
        sVar7 = sVar7 + 3;
        lVar9 = 0;
      }
    }
  }
  iVar2 = 0;
  iVar11 = 0;
  switch(lVar9) {
  case 0:
    goto switchD_00103db5_caseD_0;
  case 1:
    iVar2 = -1;
    break;
  case 2:
    *pbVar4 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
    break;
  case 3:
    *pbVar4 = (byte)((uint)local_58[1] >> 4) | (byte)(local_58[0] << 2);
    pbVar4[1] = (byte)((uint)local_58[2] >> 2) | (byte)(local_58[1] << 4);
  }
  iVar11 = iVar2;
  sVar7 = (sVar7 + lVar9) - 1;
switchD_00103db5_caseD_0:
  *out_bytes = sVar7;
  return iVar11;
}

Assistant:

int
zt_base_decode(zt_base_definition_t * def, const void * in, size_t in_bytes, void ** out, size_t * out_bytes) {
    const unsigned char * inp;
    unsigned char       * outp;
    size_t                lcount = 0;
    size_t                ocount = 0;
    size_t                mod = 0;
	ssize_t               i;

    if (!_valid_dictionary_p(def)) {
        return -1;
    }

    if (!out_bytes) {
        return -1;
    }

    if (!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    inp  = (unsigned char *)in;

    /* strip any follow on pad chars */
    for (i=in_bytes-1; i > 0; i--) {
        if (inp[i] != def->pad) {
            i = in_bytes - 1 - i;
            break;
        }
    }

    lcount = (in_bytes-i) / def->ogroups; /* number of whole input groups */
    mod = ((in_bytes-i) % def->ogroups); /* partial inputs */
    ocount = (lcount * def->igroups) + mod; /* total output bytes */

    if (out == NULL) {
        *out_bytes = ocount;
        return 0;
    }

    if (*out != NULL && *out_bytes < ocount) {
        *out_bytes = ocount;
        return -2;
    }

    outp = *((unsigned char **)out);

    if ((outp == NULL && *out_bytes == 0)) {
        /* dynamically allocate the buffer */
        if (!(outp = zt_calloc(unsigned char, ocount+1))) {
            return -1;
        }

        *out = outp;
        *out_bytes = ocount;
    }

    switch(def->base) {
        case 64:
            return _decode64(def, inp, in_bytes, outp, out_bytes);
            break;
        case 32:
            return _decode32(def, inp, in_bytes, outp, out_bytes);
            break;
        case 16:
            return _decode16(def, inp, in_bytes, outp, out_bytes);
            break;
        default:
            break;
    }

    return -1;
}